

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O3

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::value(KeyFrames<float,_void> *this,int frameNo)

{
  pointer pFVar1;
  pointer pFVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = (float)frameNo;
  pFVar2 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (fVar4 <= pFVar2->start_) {
    return (pFVar2->value_).start_;
  }
  pFVar1 = (this->frames_).
           super__Vector_base<rlottie::internal::model::KeyFrames<float,_void>::Frame,_std::allocator<rlottie::internal::model::KeyFrames<float,_void>::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar1[-1].end_ <= fVar4) {
    fVar3 = pFVar1[-1].value_.end_;
  }
  else {
    fVar3 = 0.0;
    for (; pFVar2 != pFVar1; pFVar2 = pFVar2 + 1) {
      if ((pFVar2->start_ <= fVar4) && (fVar4 < pFVar2->end_)) {
        if (pFVar2->interpolator_ == (VInterpolator *)0x0) {
          fVar4 = 0.0;
        }
        else {
          fVar4 = VInterpolator::value
                            (pFVar2->interpolator_,
                             ((float)frameNo - pFVar2->start_) / (pFVar2->end_ - pFVar2->start_));
        }
        fVar3 = (pFVar2->value_).start_;
        return ((pFVar2->value_).end_ - fVar3) * fVar4 + fVar3;
      }
    }
  }
  return fVar3;
}

Assistant:

T value(int frameNo) const
    {
        if (frames_.front().start_ >= frameNo)
            return frames_.front().value_.start_;
        if (frames_.back().end_ <= frameNo) return frames_.back().value_.end_;

        for (const auto &keyFrame : frames_) {
            if (frameNo >= keyFrame.start_ && frameNo < keyFrame.end_)
                return keyFrame.value(frameNo);
        }
        return {};
    }